

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::loadVectors(FastText *this,string *filename)

{
  element_type *peVar1;
  char cVar2;
  int32_t iVar3;
  uint uVar4;
  istream *piVar5;
  ostream *poVar6;
  invalid_argument *piVar7;
  EVP_PKEY_CTX *ctx;
  size_t i;
  ulong uVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  int64_t dim;
  int64_t n;
  ulong local_4c0;
  shared_ptr<fasttext::Matrix> mat;
  string entry;
  string word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string line;
  string local_420;
  string local_400;
  string local_3e0;
  stringstream ss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b8 [48];
  ifstream in;
  
  std::ifstream::ifstream(&in,(string *)filename,_S_in);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,filename
                   ," cannot be opened for loading!");
    std::invalid_argument::invalid_argument(piVar7,(string *)&ss);
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar5 = std::istream::_M_extract<long>((long *)&in);
  std::istream::_M_extract<long>((long *)piVar5);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&line);
  poVar6 = std::operator<<((ostream *)&std::cerr,"Trying to load precomputed stuff ");
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  if (dim == ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             dim) {
    std::make_shared<fasttext::Matrix,long&,long&>((long *)&ss,&n);
    std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&ss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_3b8);
    lVar10 = 0;
    for (local_4c0 = 0; local_4c0 < (ulong)n; local_4c0 = local_4c0 + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&line)
      ;
      if (line._M_string_length == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"could not load ");
        poVar6 = std::operator<<(poVar6,(string *)&line);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        word._M_dataplus._M_p = (pointer)&word.field_2;
        entry._M_dataplus._M_p = (pointer)&entry.field_2;
        word._M_string_length = 0;
        entry._M_string_length = 0;
        word.field_2._M_local_buf[0] = '\0';
        entry.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&line,_S_out|_S_in);
        for (lVar9 = 0;
            lVar9 <= ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->dim; lVar9 = lVar9 + 1) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&ss,(string *)&entry,' ');
          if (lVar9 == 0) {
            std::__cxx11::string::_M_assign((string *)&word);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&words,&word);
            Dictionary::add((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,&word);
          }
          else {
            std::__cxx11::string::string
                      ((string *)&local_400,entry._M_dataplus._M_p,(allocator *)&local_420);
            dVar11 = std::__cxx11::stod(&local_400,(size_t *)0x0);
            *(float *)((long)((mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->data_).super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                      lVar9 * 4 +
                      (mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->n_ * lVar10 + -4) = (float)dVar11;
            std::__cxx11::string::~string((string *)&local_400);
          }
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::__cxx11::string::~string((string *)&entry);
        std::__cxx11::string::~string((string *)&word);
      }
      lVar10 = lVar10 + 4;
    }
    std::ifstream::close();
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold
              ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,1,0);
    Dictionary::init((this->dict_).
                     super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ctx
                    );
    iVar3 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    word._M_dataplus._M_p._0_4_ =
         iVar3 + ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->bucket;
    std::make_shared<fasttext::Matrix,int,int&>((int *)&ss,(int *)&word);
    std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&ss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_3b8);
    Matrix::uniform((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,1.0 / (float)((this->args_).
                                         super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->dim);
    lVar10 = 0;
    for (uVar8 = 0; uVar8 < (ulong)n; uVar8 = uVar8 + 1) {
      uVar4 = Dictionary::getId((this->dict_).
                                super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,words.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar8);
      if (-1 < (int)uVar4) {
        iVar3 = Dictionary::nwords((this->dict_).
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        if ((int)uVar4 < iVar3) {
          peVar1 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          for (lVar9 = 0; dim != lVar9; lVar9 = lVar9 + 1) {
            *(undefined4 *)
             (peVar1->n_ * (ulong)uVar4 * 4 +
              (long)(peVar1->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar9 * 4) =
                 *(undefined4 *)
                  ((long)((mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start +
                  lVar9 * 4 +
                  (mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->n_
                  * lVar10);
          }
        }
      }
      lVar10 = lVar10 + 4;
    }
    std::__cxx11::string::~string((string *)&line);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&words);
    std::ifstream::~ifstream(&in);
    return;
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_420,dim);
  std::operator+(&local_400,"Dimension of pretrained vectors (",&local_420);
  std::operator+(&entry,&local_400,") does not match dimension (");
  std::__cxx11::to_string
            (&local_3e0,
             ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             dim);
  std::operator+(&word,&entry,&local_3e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,&word,")!"
                );
  std::invalid_argument::invalid_argument(piVar7,(string *)&ss);
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::loadVectors(const std::string& filename) {
	std::ifstream in(filename);
	std::vector<std::string> words;
	std::shared_ptr<Matrix> mat; // temp. matrix for pretrained vectors
	int64_t n, dim;
	if (!in.is_open()) {
		throw std::invalid_argument(filename + " cannot be opened for loading!");
	}
	
	in >> n >> dim;
	std::string line;
	std::getline(in, line);
	std::cerr << "Trying to load precomputed stuff " << n << " " << dim << std::endl;
	if (dim != args_->dim) {
		throw std::invalid_argument(
				"Dimension of pretrained vectors (" + std::to_string(dim) +
				") does not match dimension (" + std::to_string(args_->dim) + ")!");
	}
	mat = std::make_shared<Matrix>(n, dim);
	for (size_t i = 0; i < n; i++) {
		std::getline(in, line);
		if(line.size()>0)
		{
			std::string word;
			std::string entry;
			std::stringstream ss(line);
			for(int j=0;j < args_->dim + 1; j++)
			{
				std::getline(ss, entry, ' ');
				if(j==0)
				{
					word = entry;
					words.push_back(word);
					dict_->add(word);
				}
				else
				{
					try
					{
						mat->at(i, j-1) = std::stod(entry.c_str());
					}
					catch(const std::exception& e)
					{
						std::cerr << "could not load "<< word << " " <<  entry << " " << i << std::endl;
					}
				}
			}
		}
		else
		{
			std::cerr << "could not load "<< line << i << std::endl;
		}
	}
	in.close();
	// std::cerr << dict_->nwords() << std::endl;
	dict_->threshold(1, 0);
	dict_->init();
	input_ =
			std::make_shared<Matrix>(dict_->nwords() + args_->bucket, args_->dim);
	input_->uniform(1.0 / args_->dim);

	for (size_t i = 0; i < n; i++) {
		int32_t idx = dict_->getId(words[i]);
		if (idx < 0 || idx >= dict_->nwords()) {
			continue;
		}
		for (size_t j = 0; j < dim; j++) {
			input_->at(idx, j) = mat->at(i, j);
		}
	}
}